

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O3

int mk_rconf_read(mk_rconf *conf,char *path)

{
  char cVar1;
  mk_list *pmVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  char **str;
  mk_rconf_section *pmVar8;
  ulong uVar9;
  ushort **ppuVar10;
  long lVar11;
  char *pcVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  char cVar17;
  mk_list *pmVar18;
  bool bVar19;
  char *key;
  char *val;
  stat st;
  char tmp [4096];
  uint local_112c;
  char *local_1128;
  int local_110c;
  char *local_1108;
  char *local_1100;
  char *local_10f8;
  size_t local_10f0;
  mk_rconf_section *local_10e8;
  mk_list *local_10e0;
  char *local_10d8;
  mk_list *local_10d0;
  stat local_10c8;
  char local_1038 [4104];
  
  pcVar6 = path;
  if (((-1 < conf->level) && (iVar3 = stat(path,&local_10c8), iVar3 == -1)) &&
     (piVar5 = __errno_location(), *piVar5 == 2)) {
    if (*path == '/') {
      return -1;
    }
    if (conf->root_path != (char *)0x0) {
      pcVar6 = local_1038;
      snprintf(pcVar6,0x1000,"%s/%s",conf->root_path,path);
    }
  }
  for (pmVar18 = (conf->includes).next; pmVar18 != &conf->includes; pmVar18 = pmVar18->next) {
    iVar3 = strcmp((char *)pmVar18[-1].next,pcVar6);
    if (iVar3 == 0) {
      pcVar16 = "[config] file already included %s";
      iVar3 = 0x1001;
      goto LAB_00111bb1;
    }
  }
  conf->level = conf->level + 1;
  __stream = fopen(pcVar6,"r");
  if (__stream == (FILE *)0x0) {
    pcVar16 = "[config] I cannot open %s file";
    iVar3 = 0x1002;
LAB_00111bb1:
    mk_print(iVar3,pcVar16,pcVar6);
  }
  else {
    pcVar6 = (char *)malloc(0x1000);
    if (pcVar6 == (char *)0x0) {
      mk_rconf_read_cold_3();
    }
    else {
      pcVar16 = fgets(pcVar6,0x1000,__stream);
      if (pcVar16 == (char *)0x0) {
        fclose(__stream);
      }
      else {
        local_10e0 = &conf->sections;
        local_10d0 = &conf->metas;
        local_10d8 = pcVar6 + 9;
        local_10f0 = 0xffffffff;
        local_10e8 = (mk_rconf_section *)0x0;
        local_1128 = (char *)0x0;
        local_110c = 0;
        local_112c = 0;
        do {
          sVar7 = strlen(pcVar6);
          iVar3 = (int)sVar7;
          if ((iVar3 < 1) || (pcVar6[iVar3 - 1] != '\n')) {
            iVar3 = feof(__stream);
            uVar14 = sVar7 & 0xffffffff;
            if (iVar3 != 0) goto LAB_0011175b;
            mk_print(0x1001,"File %s",path);
            mk_print(0x1001,"Error in line %i: %s",(ulong)local_112c,
                     "Length of content has exceeded limit");
LAB_00111c79:
            fclose(__stream);
            goto LAB_00111c81;
          }
          uVar14 = (ulong)(iVar3 - 1U);
          pcVar6[uVar14] = '\0';
          if (iVar3 - 1U == 0) {
            uVar14 = 0;
          }
          else if (pcVar6[iVar3 - 2] == '\r') {
            uVar14 = (ulong)(iVar3 - 2);
            pcVar6[uVar14] = '\0';
          }
LAB_0011175b:
          local_112c = local_112c + 1;
          cVar17 = *pcVar6;
          if ((cVar17 != '\0') && (cVar17 != '#')) {
            iVar3 = (int)uVar14;
            if ((iVar3 < 10) ||
               (iVar4 = strncasecmp(pcVar6,"@INCLUDE ",9), pcVar16 = local_10d8, iVar4 != 0)) {
              if (iVar3 < 4 || cVar17 != '@') {
                if (cVar17 == '[') {
                  iVar3 = mk_string_char_search(pcVar6,0x5d,iVar3);
                  if (iVar3 < 1) {
                    mk_print(0x1001,"File %s",path);
                    mk_print(0x1001,"Error in line %i: %s",(ulong)local_112c,"Bad header definition"
                            );
                    goto LAB_00111c79;
                  }
                  if (local_110c == 0 && local_10e8 != (mk_rconf_section *)0x0) {
                    mk_print(0x1002,"Config file warning \'%s\':\n\t\t\t\tat line %i: %s",path,
                             (ulong)local_112c,"Previous section did not have keys");
                  }
                  pcVar16 = mk_string_copy_substr(pcVar6,1,iVar3);
                  pmVar8 = mk_rconf_section_add(conf,pcVar16);
                  if (pmVar8 == (mk_rconf_section *)0x0) {
                    fclose(__stream);
                    if (local_1128 != (char *)0x0) {
                      free(local_1128);
                    }
                    free(pcVar6);
                    pcVar6 = pcVar16;
                    goto LAB_00111c81;
                  }
                  local_10e8 = pmVar8;
                  free(pcVar16);
                  local_110c = 0;
                }
                else {
                  if (local_1128 == (char *)0x0) {
                    uVar9 = 1;
                    if (1 < iVar3) {
                      uVar9 = uVar14;
                    }
                    uVar14 = 0;
                    local_10f8 = path;
                    do {
                      uVar15 = uVar9;
                      if ((int)uVar9 - 1 == uVar14) break;
                      uVar15 = uVar14 + 1;
                      ppuVar10 = __ctype_b_loc();
                      lVar11 = uVar14 + 1;
                      uVar14 = uVar15;
                    } while (((*ppuVar10)[pcVar6[lVar11]] & 1) != 0);
                    local_1128 = mk_string_copy_substr(pcVar6,0,(int)uVar15);
                    local_10f0 = strlen(local_1128);
                    path = local_10f8;
                    if ((int)uVar15 == iVar3) goto LAB_00111838;
                    cVar17 = *pcVar6;
                  }
                  bVar19 = *local_1128 == '\0';
                  if (cVar17 == *local_1128 && !bVar19) {
                    lVar11 = 1;
                    do {
                      cVar17 = pcVar6[lVar11];
                      cVar1 = local_1128[lVar11];
                      bVar19 = cVar1 == '\0';
                      if (cVar17 != cVar1) break;
                      lVar11 = lVar11 + 1;
                    } while (cVar1 != '\0');
                  }
                  ppuVar10 = __ctype_b_loc();
                  if (!bVar19) {
                    pcVar6 = "[config] Inconsistent use of tab and space";
                    if (((*ppuVar10)[cVar17] & 1) == 0) {
                      pcVar6 = "[config] Indentation level is too low";
                    }
LAB_00111d2f:
                    mk_print(0x1001,pcVar6);
                    mk_config_error(path,local_112c,"Invalid indentation level");
                    fclose(__stream);
                    return -1;
                  }
                  if (((*ppuVar10)[cVar17] & 1) != 0) {
                    pcVar6 = "[config] Extra indentation level found";
                    goto LAB_00111d2f;
                  }
                  iVar3 = iVar3 - (int)local_10f0;
                  if ((iVar3 != 0 && pcVar6[(int)local_10f0] != '#') &&
                     ((((pcVar16 = pcVar6 + (int)local_10f0, iVar3 < 3 ||
                        (pcVar6[(int)local_10f0] != '-')) || (pcVar16[1] != '-')) ||
                      (pcVar16[2] != '-')))) {
                    iVar4 = mk_string_char_search(pcVar16,0x20,iVar3);
                    local_1108 = mk_string_copy_substr(pcVar16,0,iVar4);
                    local_1100 = mk_string_copy_substr(pcVar16 + iVar4,1,iVar3 - iVar4);
                    if (((iVar4 < 0) || (local_1108 == (char *)0x0)) || (local_1100 == (char *)0x0))
                    {
                      mk_config_error(path,local_112c,"Each key must have a value");
                    }
                    else {
                      mk_string_trim(&local_1108);
                      mk_string_trim(&local_1100);
                      pcVar16 = local_1100;
                      if (*local_1100 != '\0') {
                        if ((conf->sections).next == local_10e0) {
                          mk_print(0x1001,"Error: there are not sections available on %s!",
                                   conf->file);
                        }
                        else {
                          local_10f8 = local_1108;
                          pmVar18 = local_10e0->prev;
                          puVar13 = (undefined8 *)malloc(0x20);
                          if (puVar13 == (undefined8 *)0x0) {
                            perror("malloc");
                          }
                          pcVar12 = mk_string_dup(local_10f8);
                          *puVar13 = pcVar12;
                          pcVar16 = mk_string_dup(pcVar16);
                          puVar13[1] = pcVar16;
                          pmVar2 = pmVar18[-1].prev;
                          pmVar18[-1].prev = (mk_list *)(puVar13 + 2);
                          puVar13[3] = pmVar18 + -1;
                          puVar13[2] = pmVar2;
                          pmVar2->next = (mk_list *)(puVar13 + 2);
                        }
                        free(local_1108);
                        free(local_1100);
                        local_110c = local_110c + 1;
                        goto LAB_00111838;
                      }
                      mk_config_error(path,local_112c,"Key has an empty value");
                    }
                    fclose(__stream);
                    free(local_1108);
                    pcVar6 = local_1100;
LAB_00111c81:
                    free(pcVar6);
                    return -1;
                  }
                }
              }
              else {
                str = (char **)malloc(0x20);
                if (str == (char **)0x0) {
                  mk_rconf_read_cold_1();
                  return -1;
                }
                pcVar16 = strchr(pcVar6,0x20);
                iVar4 = (int)pcVar16 - (int)pcVar6;
                pcVar16 = mk_string_copy_substr(pcVar6,1,iVar4);
                *str = pcVar16;
                mk_string_trim(str);
                pcVar16 = mk_string_copy_substr(pcVar6,iVar4 + 1,iVar3);
                str[1] = pcVar16;
                mk_string_trim(str + 1);
                pmVar18 = local_10d0->prev;
                local_10d0->prev = (mk_list *)(str + 2);
                str[3] = (char *)local_10d0;
                str[2] = (char *)pmVar18;
                pmVar18->next = (mk_list *)(str + 2);
              }
            }
            else {
              pcVar12 = strchr(local_10d8,0x2a);
              if (pcVar12 == (char *)0x0) {
                iVar3 = mk_rconf_read(conf,pcVar16);
              }
              else {
                iVar3 = mk_rconf_read_glob(conf,pcVar16);
              }
              if (iVar3 == -1) {
                conf->level = conf->level + -1;
                fclose(__stream);
                if (local_1128 != (char *)0x0) {
                  free(local_1128);
                }
                goto LAB_00111c81;
              }
            }
          }
LAB_00111838:
          pcVar16 = fgets(pcVar6,0x1000,__stream);
        } while (pcVar16 != (char *)0x0);
        fclose(__stream);
        if (local_1128 != (char *)0x0) {
          free(local_1128);
        }
      }
      free(pcVar6);
      puVar13 = (undefined8 *)malloc(0x18);
      if (puVar13 != (undefined8 *)0x0) {
        pcVar6 = mk_string_dup(path);
        *puVar13 = pcVar6;
        pmVar18 = (conf->includes).prev;
        (conf->includes).prev = (mk_list *)(puVar13 + 1);
        puVar13[2] = &conf->includes;
        puVar13[1] = pmVar18;
        pmVar18->next = (mk_list *)(puVar13 + 1);
        conf->level = conf->level + -1;
        return 0;
      }
      mk_rconf_read_cold_2();
    }
  }
  return -1;
}

Assistant:

static int mk_rconf_read(struct mk_rconf *conf, const char *path)
{
    int i;
    int len;
    int ret;
    int line = 0;
    int indent_len = -1;
    int n_keys = 0;
    char *buf;
    char tmp[PATH_MAX];
    char *section = NULL;
    char *indent = NULL;
    char *key, *val;
    char *cfg_file = (char *) path;
    struct stat st;
    struct mk_rconf_file *file;
    struct mk_rconf_section *current = NULL;
    FILE *f;

    /* Check if the path exists (relative cases for included files) */
    if (conf->level >= 0) {
        ret = stat(path, &st);
        if (ret == -1 && errno == ENOENT) {
            /* Try to resolve the real path (if exists) */
            if (path[0] == '/') {
                return -1;
            }

            if (conf->root_path) {
                snprintf(tmp, PATH_MAX, "%s/%s", conf->root_path, path);
                cfg_file = tmp;
            }
        }
    }

    /* Check this file have not been included before */
    ret = is_file_included(conf, cfg_file);
    if (ret == MK_TRUE) {
        mk_err("[config] file already included %s", cfg_file);
        return -1;
    }

    conf->level++;

    /* Open configuration file */
    if ((f = fopen(cfg_file, "r")) == NULL) {
        mk_warn("[config] I cannot open %s file", cfg_file);
        return -1;
    }

    /* Allocate temporal buffer to read file content */
    buf = mk_mem_alloc(MK_RCONF_KV_SIZE);
    if (!buf) {
        fclose(f);
        perror("malloc");
        return -1;
    }

    /* looking for configuration directives */
    while (fgets(buf, MK_RCONF_KV_SIZE, f)) {
        len = strlen(buf);
        if (len > 0 && buf[len - 1] == '\n') {
            buf[--len] = 0;
            if (len && buf[len - 1] == '\r') {
                buf[--len] = 0;
            }
        }
        else {
            /*
             * If we don't find a break line, validate if we got an EOF or not. No EOF
             * means that the incoming string is not finished so we must raise an
             * exception.
             */
            if (!feof(f)) {
                mk_config_error(path, line, "Length of content has exceeded limit");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* Line number */
        line++;

        if (!buf[0]) {
            continue;
        }

        /* Skip commented lines */
        if (buf[0] == '#') {
            continue;
        }

        if (len > 9 && strncasecmp(buf, "@INCLUDE ", 9) == 0) {
            if (strchr(buf + 9, '*') != NULL) {
                ret = mk_rconf_read_glob(conf, buf + 9);
            }
            else {
                ret = mk_rconf_read(conf, buf + 9);
            }
            if (ret == -1) {
                conf->level--;
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }
        else if (buf[0] == '@' && len > 3) {
            ret = mk_rconf_meta_add(conf, buf, len);
            if (ret == -1) {
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }

        /* Section definition */
        if (buf[0] == '[') {
            int end = -1;
            end = mk_string_char_search(buf, ']', len);
            if (end > 0) {
                /*
                 * Before to add a new section, lets check the previous
                 * one have at least one key set
                 */
                if (current && n_keys == 0) {
                    mk_rconf_warning(path, line, "Previous section did not have keys");
                }

                /* Create new section */
                section = mk_string_copy_substr(buf, 1, end);
                current = mk_rconf_section_add(conf, section);
                if (!current) {
                    fclose(f);
                    if (indent) {
                        mk_mem_free(indent);
                    }
                    mk_mem_free(buf);
                    mk_mem_free(section);
                    return -1;
                }
                mk_mem_free(section);
                n_keys = 0;
                continue;
            }
            else {
                mk_config_error(path, line, "Bad header definition");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* No separator defined */
        if (!indent) {
            i = 0;

            do { i++; } while (i < len && isblank(buf[i]));

            indent = mk_string_copy_substr(buf, 0, i);
            indent_len = strlen(indent);

            /* Blank indented line */
            if (i == len) {
                continue;
            }
        }

        /* Validate indentation level */
        if (check_indent(buf, indent) < 0) {
            mk_config_error(path, line, "Invalid indentation level");
            fclose(f);
            return -1;
        }

        if (buf[indent_len] == '#' || indent_len == len) {
            continue;
        }

        if (len - indent_len >= 3 && strncmp(buf + indent_len, "---", 3) == 0) {
            continue;
        }

        /* Get key and val */
        i = mk_string_char_search(buf + indent_len, ' ', len - indent_len);
        key = mk_string_copy_substr(buf + indent_len, 0, i);
        val = mk_string_copy_substr(buf + indent_len + i, 1, len - indent_len - i);

        if (!key || !val || i < 0) {
            mk_config_error(path, line, "Each key must have a value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Trim strings */
        mk_string_trim(&key);
        mk_string_trim(&val);

        if (strlen(val) == 0) {
            mk_config_error(path, line, "Key has an empty value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Register entry: key and val are copied as duplicated */
        mk_rconf_section_entry_add(conf, key, val);

        /* Free temporal key and val */
        mk_mem_free(key);
        mk_mem_free(val);

        n_keys++;
    }

    if (section && n_keys == 0) {
        /* No key, no warning */
    }

    /*
    struct mk_config_section *s;
    struct mk_rconf_entry *e;

    s = conf->section;
    while(s) {
        printf("\n[%s]", s->name);
        e = s->entry;
        while(e) {
            printf("\n   %s = %s", e->key, e->val);
            e = e->next;
        }
        s = s->next;
    }
    fflush(stdout);
    */
    fclose(f);
    if (indent) {
        mk_mem_free(indent);
    }
    mk_mem_free(buf);

    /* Append this file to the list */
    file = mk_mem_alloc(sizeof(struct mk_rconf_file));
    if (!file) {
        conf->level--;
        return -1;
    }

    file->path = mk_string_dup(path);
    mk_list_add(&file->_head, &conf->includes);
    conf->level--;
    return 0;
}